

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_OperatorPhase16(opm_t *chip)

{
  uint32_t uVar1;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar1 = chip->cycles;
  chip->op_mod[2] = chip->op_mod[1];
  chip->op_fb[1] = chip->op_fb[0];
  chip->op_mod[1] = chip->op_mod[0];
  chip->op_fb[0] = (ushort)chip->ch_fb[uVar1 + 0x11 & 7];
  return;
}

Assistant:

static void OPM_OperatorPhase16(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 17) % 32;
    // hack
    chip->op_mod[2] = chip->op_mod[1];
    chip->op_fb[1] = chip->op_fb[0];

    chip->op_mod[1] = chip->op_mod[0];
    chip->op_fb[0] = chip->ch_fb[slot % 8];
}